

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcut.cc
# Opt level: O0

void anon_unknown.dwarf_b63f::PrintUsage(ostream *stream)

{
  ostream *poVar1;
  void *pvVar2;
  ostream *in_RDI;
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [24];
  ostream *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  ostream *local_8;
  
  local_8 = in_RDI;
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8," bcut - binary file cut");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  usage:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       bcut [ options ] [ infile ] > stdout");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  options:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -s s  : start number       (   int)[");
  local_c = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_c);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,0);
  poVar1 = std::operator<<(poVar1,"][ 0 <= s <= e ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -e e  : end number         (   int)[");
  local_10 = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = std::operator<<(poVar1,"EOF");
  poVar1 = std::operator<<(poVar1,"][ s <= e <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -l l  : block length       (   int)[");
  local_14 = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_14);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,1);
  poVar1 = std::operator<<(poVar1,"][ 1 <= l <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -m m  : block order        (   int)[");
  local_18 = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = std::operator<<(poVar1,"l-1");
  poVar1 = std::operator<<(poVar1,"][ 0 <= m <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       +type : data type                  [");
  local_1c = (int)std::setw(5);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::kDefaultDataType);
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"c",&local_41);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"C",(allocator *)&stack0xffffffffffffff87);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"s",&local_a1);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"S",&local_c9);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"h",&local_f1);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"H",&local_119);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"i",&local_141);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"I",&local_169);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"l",&local_191);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"L",&local_1b9);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"f",&local_1e1);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"d",&local_209);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_8,"                 ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"e",&local_231);
  sptk::PrintDataType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       -h    : print this message");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  infile:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       data sequence              (  type)[stdin]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"  stdout:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8,"       cut data sequence          (  type)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_8," SPTK: version ");
  poVar1 = std::operator<<(poVar1,"4.3");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " bcut - binary file cut" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       bcut [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -s s  : start number       (   int)[" << std::setw(5) << std::right << kDefaultStartNumber << "][ 0 <= s <= e ]" << std::endl;  // NOLINT
  *stream << "       -e e  : end number         (   int)[" << std::setw(5) << std::right << "EOF"               << "][ s <= e <=   ]" << std::endl;  // NOLINT
  *stream << "       -l l  : block length       (   int)[" << std::setw(5) << std::right << kDefaultBlockLength << "][ 1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m  : block order        (   int)[" << std::setw(5) << std::right << "l-1"               << "][ 0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       +type : data type                  [" << std::setw(5) << std::right << kDefaultDataType    << "]" << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("c", stream); sptk::PrintDataType("C", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("s", stream); sptk::PrintDataType("S", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("h", stream); sptk::PrintDataType("H", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("i", stream); sptk::PrintDataType("I", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("l", stream); sptk::PrintDataType("L", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("f", stream); sptk::PrintDataType("d", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("e", stream);                                   *stream << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (  type)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       cut data sequence          (  type)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}